

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O1

void render_obj(gba_ppu_t *ppu)

{
  int iVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  uint uVar11;
  short sVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  int sprite_x;
  int iVar19;
  int iVar20;
  uint uVar21;
  ushort uVar22;
  short sVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  bool bVar27;
  short sVar28;
  int iVar29;
  uint uVar30;
  int iVar31;
  short sVar32;
  byte bVar33;
  uint uVar34;
  uint uVar35;
  ushort uVar36;
  int local_a8;
  short local_a0;
  
  lVar15 = 0x26162;
  do {
    *(undefined1 *)((long)(ppu->screen + -1) + 0x3be + lVar15) = 0;
    (&ppu->screen[0][0x77].g)[lVar15] = '\0';
    *(ushort *)((long)ppu + lVar15 * 2 + -0x26342) = *(ushort *)ppu->pram | 0x8000;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0x26252);
  uVar2 = ppu->y;
  uVar34 = (uint)uVar2;
  lVar15 = 0;
  do {
    uVar3 = *(ushort *)(ppu->oam + lVar15 * 8);
    uVar4 = *(ushort *)(ppu->oam + lVar15 * 8 + 2);
    uVar16 = (ulong)(uVar3 >> 10 & 0xfffffff0);
    iVar7 = *(int *)((long)sprite_heights[0] + (ulong)(uVar4 >> 0xe) * 4 + uVar16);
    iVar29 = iVar7 / 2;
    uVar36 = uVar3 >> 8 & 3;
    uVar17 = uVar3 & 0xff;
    iVar18 = 0;
    if (uVar36 == 3) {
      iVar18 = iVar29;
    }
    iVar8 = iVar18 + uVar17;
    iVar18 = iVar18 + -0x100 + uVar17;
    if (iVar8 < 0xa0) {
      iVar18 = iVar8;
    }
    uVar24 = uVar34 - iVar18;
    uVar17 = ~uVar24 + iVar7;
    if ((uVar4 >> 0xd & 1) == 0) {
      uVar17 = uVar24;
    }
    if (uVar36 == 1) {
      uVar17 = uVar24;
    }
    if (uVar36 == 3) {
      uVar17 = uVar24;
    }
    iVar8 = *(int *)((long)sprite_widths[0] + (ulong)(uVar4 >> 0xe) * 4 + uVar16);
    iVar31 = iVar8 / 2;
    iVar13 = 0;
    if (uVar36 == 3) {
      iVar13 = iVar31;
    }
    iVar19 = iVar8 + 7;
    if (-1 < iVar8) {
      iVar19 = iVar8;
    }
    iVar25 = iVar13 + (uVar4 & 0x1ff);
    iVar13 = iVar13 + -0x200 + (uVar4 & 0x1ff);
    if (iVar25 < 0xf0) {
      iVar13 = iVar25;
    }
    iVar20 = iVar18 + iVar7;
    iVar25 = iVar13 + iVar8;
    local_a8 = iVar13;
    if ((uVar36 | 2) == 3) {
      uVar16 = (ulong)(uVar4 >> 4 & 0x3e0);
      sVar12 = *(short *)(ppu->oam + uVar16 + 6);
      sVar32 = *(short *)(ppu->oam + uVar16 + 0xe);
      sVar23 = *(short *)(ppu->oam + uVar16 + 0x16);
      sVar28 = *(short *)(ppu->oam + uVar16 + 0x1e);
      if (uVar36 == 3) {
        iVar18 = iVar18 - iVar29;
        iVar20 = iVar20 + iVar29;
        local_a8 = iVar13 + iVar31 * -2;
        if (local_a8 < 1) {
          local_a8 = 0;
        }
        iVar25 = iVar25 + iVar31 * 2;
        if (iVar25 < 0xf1) {
          iVar25 = 0xf0;
        }
      }
    }
    else {
      sVar12 = 0xff;
      sVar32 = 0;
      sVar23 = 0;
      sVar28 = 0xff;
    }
    if (((uVar36 != 2) && (iVar18 <= (int)uVar34)) && ((int)uVar34 < iVar20)) {
      uVar24 = -iVar31;
      if (uVar36 != 3) {
        uVar24 = 0;
      }
      iVar18 = 0;
      if (uVar36 == 3) {
        iVar18 = iVar31;
      }
      if ((int)uVar24 < iVar18 + iVar8) {
        uVar5 = *(ushort *)(ppu->oam + lVar15 * 8 + 4);
        uVar21 = uVar3 & 0x2000;
        uVar22 = uVar3 >> 10 & 3;
        iVar26 = (uVar24 - iVar31) * (int)sVar23 + (int)sVar28 * (uVar17 - iVar29);
        iVar20 = (uVar24 - iVar31) * (int)sVar12 + (int)sVar32 * (uVar17 - iVar29);
        do {
          if ((uVar36 | 2) == 3) {
            uVar30 = (iVar20 >> 8) + iVar31;
            if (((int)uVar30 < iVar8 && -1 < (int)uVar30) &&
               (uVar35 = (iVar26 >> 8) + iVar29, (int)uVar35 < iVar7 && -1 < (int)uVar35))
            goto LAB_001180d2;
          }
          else {
            uVar30 = uVar24;
            uVar35 = uVar17;
            if ((uVar4 >> 0xc & 1) != 0) {
              uVar30 = ~uVar24 + iVar8;
            }
LAB_001180d2:
            uVar14 = uVar35 + 7;
            if (-1 < (int)uVar35) {
              uVar14 = uVar35;
            }
            uVar6 = (ppu->DISPCNT).raw;
            iVar9 = ((int)uVar14 >> 3) << 5;
            if ((uVar6 & 0x40) != 0) {
              iVar9 = (((int)uVar14 >> 3) << ((byte)(uVar3 >> 0xd) & 1)) * (iVar19 >> 3);
            }
            uVar14 = iVar13 + uVar24;
            if (((uVar14 < 0xf0) && (local_a8 <= (int)uVar14)) &&
               (((int)uVar14 < iVar25 &&
                (((short)ppu->objbuf[uVar14].raw < 0 ||
                 ((uVar5 >> 10 & 3) < (ushort)ppu->obj_priorities[uVar14])))))) {
              uVar11 = uVar30 + 7;
              if (-1 < (int)uVar30) {
                uVar11 = uVar30;
              }
              iVar1 = (int)uVar30 % 8 + ((int)uVar35 % 8) * 8;
              bVar33 = ppu->vram[(iVar1 >> ((uVar3 & 0x2000) == 0)) +
                                 ((((int)uVar11 >> 3) << (sbyte)(uVar21 >> 0xd)) + (uVar5 & 0x3ff) +
                                 iVar9) * 0x20 + 0x10000];
              local_a0 = (short)uVar21;
              if (local_a0 == 0) {
                bVar33 = bVar33 >> (((char)iVar1 - ((char)iVar1 - (char)(iVar1 >> 0x1f) & 0x3eU)) *
                                    '\x04' & 0x1f) & 0xf;
              }
              if (bVar33 != 0) {
                uVar30 = (uVar5 >> 7 & 0xffffffe0 | 0x200) + (uint)bVar33 * 2;
                if (local_a0 != 0) {
                  uVar30 = bVar33 + 0x200 + (uint)bVar33;
                }
                if (uVar22 == 2) {
                  ppu->obj_window[uVar14] = true;
                }
                else {
                  if ((int)(uint)(byte)(ppu->WIN0H).raw < (int)uVar14 ||
                      (int)uVar14 < (int)(uint)((ppu->WIN0H).raw >> 8)) {
                    bVar27 = false;
                  }
                  else {
                    bVar27 = uVar2 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar2;
                  }
                  if ((int)(uint)(byte)(ppu->WIN1H).raw < (int)uVar14 ||
                      (int)uVar14 < (int)(uint)((ppu->WIN1H).raw >> 8)) {
                    bVar10 = false;
                  }
                  else {
                    bVar10 = uVar2 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar2;
                  }
                  uVar35 = (uint)(ppu->WININ).raw;
                  bVar33 = (byte)(uVar6 >> 8);
                  if ((bVar33 >> 5 & 1 & bVar27) == 0) {
                    if (((bVar33 >> 6 & 1 & bVar10) == 0) &&
                       ((uVar35 = (uint)(ppu->WINOUT).raw, -1 < (short)uVar6 ||
                        (ppu->obj_window[uVar14] == false)))) {
                      uVar35 = (uint)(byte)(bVar27 | bVar10 | (uVar6 & 0x6000) == 0 |
                                           (byte)((uVar35 & 0x10) >> 4));
                    }
                    else {
                      uVar35 = uVar35 >> 0xc & 1;
                    }
                  }
                  else {
                    uVar35 = ((ppu->WININ).raw & 0x10) >> 4;
                  }
                  if (uVar35 != 0) {
                    ppu->obj_priorities[uVar14] = (byte)(uVar5 >> 10) & 3;
                    ppu->obj_alpha[uVar14] = uVar22 == 1;
                    ppu->objbuf[uVar14].raw = *(ushort *)(ppu->pram + uVar30) & 0x7fff;
                  }
                }
              }
            }
          }
          uVar24 = uVar24 + 1;
          iVar26 = iVar26 + sVar23;
          iVar20 = iVar20 + sVar12;
        } while (iVar18 + iVar8 != uVar24);
      }
    }
    lVar15 = lVar15 + 1;
    if (lVar15 == 0x80) {
      return;
    }
  } while( true );
}

Assistant:

void render_obj(gba_ppu_t* ppu) {
    obj_attr0_t attr0;
    obj_attr1_t attr1;
    obj_attr2_t attr2;

    clear_obj(ppu);

    for (int sprite = 0; sprite < 128; sprite++) {
        attr0.raw = half_from_byte_array(ppu->oam, (sprite * 8) + 0);
        attr1.raw = half_from_byte_array(ppu->oam, (sprite * 8) + 2);
        attr2.raw = half_from_byte_array(ppu->oam, (sprite * 8) + 4);

        int height = sprite_heights[attr0.shape][attr1.size];
        int width = sprite_widths[attr0.shape][attr1.size];
        int tiles_wide = width / 8;

        int hheight = height / 2;
        int hwidth = width / 2;

        bool is_double_affine = attr0.affine_object_mode == OBJ_AFF_MODE_DOUBLE;
        bool is_affine = attr0.affine_object_mode == OBJ_AFF_MODE_AFFINE || is_double_affine;

        int adjusted_x = attr1.x;
        int adjusted_y = attr0.y;

        if (is_double_affine) {
            adjusted_x += hwidth;
            adjusted_y += hheight;
        }

        if (adjusted_x >= 240) {
            adjusted_x -= 512;
        }
        if (adjusted_y >= 160) {
            adjusted_y -= 256;
        }

        int sprite_y = ppu->y - adjusted_y;
        if (!is_affine && attr1.vflip) {
            sprite_y = height - sprite_y - 1;
        }

        int screen_min_y = adjusted_y;
        int screen_max_y = adjusted_y + height;

        int screen_min_x = adjusted_x;
        int screen_max_x = adjusted_x + width;


        obj_affine_t affine;
        if (is_affine) {
            affine.pa = half_from_byte_array(ppu->oam, attr1.affine_index * 32 + 6);
            affine.pb = half_from_byte_array(ppu->oam, attr1.affine_index * 32 + 14);
            affine.pc = half_from_byte_array(ppu->oam, attr1.affine_index * 32 + 22);
            affine.pd = half_from_byte_array(ppu->oam, attr1.affine_index * 32 + 30);
            if (is_double_affine) { // double rendering area
                screen_min_y -= hheight;
                screen_max_y += hheight;

                screen_min_x -= hwidth;
                screen_max_x += hwidth;

                screen_min_x -= (width / 2);
                if (screen_min_x < 0) {
                    screen_min_x = 0;
                }
                screen_max_x += (width / 2);
                if (screen_max_x < GBA_SCREEN_X) {
                    screen_max_x = GBA_SCREEN_X;
                }
            }

        } else {
            // Set to identity matrix
            affine.pa = 0xFF;
            affine.pb = 0x00;
            affine.pc = 0x00;
            affine.pd = 0xFF;
        }

        if (ppu->y >= screen_min_y && ppu->y < screen_max_y) { // If the sprite is visible, we should draw it.
            if (attr0.affine_object_mode != OBJ_AFF_MODE_HIDE) { // Not disabled
                int sprite_x_start = is_double_affine ? -hwidth : 0;
                int sprite_x_end   = is_double_affine ? width + hwidth : width;
                for (int sprite_x = sprite_x_start; sprite_x < sprite_x_end; sprite_x++) {
                    int adjusted_sprite_x = sprite_x;
                    int adjusted_sprite_y = sprite_y;

                    if (is_affine) {
                        adjusted_sprite_x = affine.pa * (sprite_x - hwidth) + affine.pb * (sprite_y - hheight);
                        adjusted_sprite_x >>= 8;
                        adjusted_sprite_x += hwidth;

                        if (adjusted_sprite_x >= width || adjusted_sprite_x < 0) {
                            continue;
                        }

                        adjusted_sprite_y = affine.pc * (sprite_x - hwidth) + affine.pd * (sprite_y - hheight);
                        adjusted_sprite_y >>= 8;
                        adjusted_sprite_y += hheight;

                        if (adjusted_sprite_y >= height || adjusted_sprite_y < 0) {
                            continue;
                        }

                    } else if (attr1.hflip) {
                        adjusted_sprite_x = width - sprite_x - 1;
                    }

                    int y_tid_offset;
                    int sprite_tile_y = adjusted_sprite_y / 8;
                    if (ppu->DISPCNT.obj_character_vram_mapping) { // 1D
                        // Tiles are twice as wide in 256 color mode
                        y_tid_offset = tiles_wide * (sprite_tile_y << attr0.is_256color);
                    } else { // 2D
                        y_tid_offset = 32 * sprite_tile_y;
                    }
                    // After adding this offset, we won't need to worry about 1D vs 2D,
                    // because in either case they'll be right next to each other in memory.
                    int tid = attr2.tid + y_tid_offset;

                    // Don't use the adjusted X or Y here. There'd be no point in transforming the sprite, otherwise.
                    int screen_x = sprite_x + adjusted_x;
                    // Only draw if we've never drawn anything there before. Lower indices have higher priority
                    // and that's the order we're drawing them here.
                    if (screen_x < GBA_SCREEN_X && screen_x >= 0 && screen_x >= screen_min_x && screen_x < screen_max_x && (ppu->objbuf[screen_x].transparent || attr2.priority < ppu->obj_priorities[screen_x])) {
                        // Tiles are twice as wide in 256 color mode
                        int x_tid_offset = (adjusted_sprite_x / 8) << attr0.is_256color;
                        int tid_offset_by_x = tid + x_tid_offset;
                        word tile_address = 0x10000 + tid_offset_by_x * OBJ_TILE_SIZE;

                        int in_tile_x = adjusted_sprite_x % 8;
                        int in_tile_y = adjusted_sprite_y % 8;

                        int in_tile_offset = in_tile_x + in_tile_y * 8;
                        tile_address += in_tile_offset >> (!attr0.is_256color);

                        byte tile = ppu->vram[tile_address];
                        if (!attr0.is_256color) {
                            tile >>= (in_tile_offset % 2) * 4;
                            tile &= 0xF;
                        }

                        if (tile != 0) {

                            word palette_address = 0x200; // OBJ palette base
                            if (attr0.is_256color) {
                                palette_address += 2 * tile;
                            } else {
                                palette_address += (0x20 * attr2.pb + 2 * tile);
                            }
                            if (attr0.graphics_mode == OBJ_MODE_OBJWIN) {
                                ppu->obj_window[screen_x] = true;
                            } else {
                                if (should_render_pixel_window(ppu, screen_x, ppu->y, ppu->WININ.win0_obj_enable, ppu->WININ.win1_obj_enable, ppu->WINOUT.outside_obj_enable, ppu->WINOUT.obj_obj_enable)) {
                                    ppu->obj_priorities[screen_x] = attr2.priority;
                                    ppu->obj_alpha[screen_x] = attr0.graphics_mode == OBJ_MODE_ALPHA;
                                    ppu->objbuf[screen_x].raw = half_from_byte_array(ppu->pram, palette_address);
                                    ppu->objbuf[screen_x].transparent = false;
                                }
                            }
                        }
                    }
                }
            }
        }
    }
}